

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task32.cpp
# Opt level: O1

bool is_bin(string *str)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)str);
  bVar2 = true;
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)str);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)str);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)str);
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::string::compare((char *)str);
          bVar2 = iVar1 == 0;
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool is_bin (const string& str) {
    return str == "+" || str == "-" || str == "*" || str == "/" || str == "^";
}